

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O2

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_cross_trade *m)

{
  iterator iVar1;
  uint64_t uVar2;
  uint64_t order_book_id;
  undefined1 local_80 [64];
  trade t;
  
  order_book_id = itch_uatoi(m->OrderBook,6);
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,&order_book_id);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur != (__node_type *)0x0) {
    uVar2 = itch_uatoi(m->CrossPrice,10);
    t.size = itch_uatoi(m->Quantity,9);
    t.timestamp = this->time_sec * 1000 + this->time_msec;
    t.sign = crossing;
    t.price = uVar2;
    make_trade_event((event *)local_80,
                     (string *)
                     ((long)iVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                            ._M_cur + 0x10),t.timestamp,&t,0);
    std::function<void_(const_helix::event_&)>::operator()(&this->_process_event,(event *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_cross_trade* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        uint64_t cross_price = itch_uatoi(m->CrossPrice, sizeof(m->CrossPrice));
        uint64_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));
        auto& ob = it->second;
        trade t{timestamp(), cross_price, quantity, trade_sign::crossing};
        _process_event(make_trade_event(ob.symbol(), timestamp(), &t));
    }
}